

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

bool __thiscall IRBuilderAsmJs::IsLoopBodyReturnIPInstr(IRBuilderAsmJs *this,Instr *instr)

{
  Opnd *this_00;
  StackSym *pSVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  undefined4 *puVar5;
  JitLoopBodyData *pJVar6;
  
  this_00 = instr->m_dst;
  if ((this_00 != (Opnd *)0x0) && (OVar3 = IR::Opnd::GetKind(this_00), OVar3 == OpndKindReg)) {
    OVar3 = IR::Opnd::GetKind(this_00);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    pSVar1 = (StackSym *)this_00[1]._vptr_Opnd;
    pJVar6 = GetJitLoopBodyData(this);
    return pSVar1 == pJVar6->m_loopBodyRetIPSym;
  }
  return false;
}

Assistant:

bool
IRBuilderAsmJs::IsLoopBodyReturnIPInstr(IR::Instr * instr) const
{
    IR::Opnd * dst = instr->GetDst();
    return (dst && dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym == GetJitLoopBodyData().GetLoopBodyRetIPSym());
}